

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O3

Orientation * __thiscall
stateObservation::kine::Orientation::integrate(Orientation *this,Vector3 *dt_x_omega)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  long lVar6;
  char *__function;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double local_e8;
  double local_b8;
  double dStack_b0;
  double local_98 [6];
  double local_68;
  double dStack_60;
  double local_58;
  ulong local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  
  bVar2 = (this->m_).isSet_.b_;
  if ((this->q_).isSet_.b_ == false) {
    if (bVar2 == false) {
      __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                    ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
    }
    auVar14 = *(undefined1 (*) [16])
               (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array;
    local_e8 = (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
    dVar7 = local_e8 * local_e8 + auVar14._8_8_ * auVar14._8_8_ + auVar14._0_8_ * auVar14._0_8_;
    dVar9 = SQRT(dVar7);
    if (9.999999999999999e-33 < dVar7) {
      auVar13._8_8_ = dVar9;
      auVar13._0_8_ = dVar9;
      auVar14 = divpd(auVar14,auVar13);
      local_e8 = local_e8 / dVar9;
    }
    else {
      auVar14 = ZEXT816(0);
      local_e8 = 1.0;
    }
    dVar9 = (double)(-(ulong)(9.999999999999999e-33 < dVar7) & (ulong)dVar9);
    dVar7 = sin(dVar9);
    dVar9 = cos(dVar9);
    if (((this->m_).isSet_.b_ == true) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
      dVar12 = 1.0 - dVar9;
      local_b8 = auVar14._0_8_;
      dStack_b0 = auVar14._8_8_;
      dVar11 = dVar12 * local_b8;
      dVar8 = local_e8 * dVar12 * dStack_b0;
      lVar6 = 0;
      do {
        dVar19 = *(double *)
                  ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar6 + 0x10);
        pdVar1 = (double *)
                 ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar6);
        dVar22 = *pdVar1;
        dVar10 = pdVar1[1];
        *(double *)((long)local_98 + lVar6) =
             dVar10 * (dStack_b0 * dVar11 - local_e8 * dVar7) + dVar22 * (dVar9 + dVar11 * local_b8)
             + dVar19 * (local_e8 * dVar11 + dStack_b0 * dVar7);
        *(double *)((long)local_98 + lVar6 + 8) =
             dVar10 * (dVar9 + dStack_b0 * dVar12 * dStack_b0) +
             dVar22 * (dStack_b0 * dVar11 + local_e8 * dVar7) + dVar19 * (dVar8 - local_b8 * dVar7);
        *(double *)((long)local_98 + lVar6 + 0x10) =
             (dVar8 + local_b8 * dVar7) * dVar10 + dVar19 * (dVar12 * local_e8 * local_e8 + dVar9) +
             (local_e8 * dVar11 - dStack_b0 * dVar7) * dVar22;
        lVar6 = lVar6 + 0x18;
      } while (lVar6 != 0x48);
LAB_00117087:
      (this->m_).isSet_.b_ = true;
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = local_98[0];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = local_98[1];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = local_98[2];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = local_98[3];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = local_98[4];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = local_98[5];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = local_68;
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = dStack_60;
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = local_58;
      return this;
    }
LAB_0011717a:
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  else {
    dVar9 = (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[0];
    dVar7 = (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[1];
    auVar14 = *(undefined1 (*) [16])
               (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array;
    local_38 = (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
    uStack_30 = 0;
    dVar11 = local_38 * local_38 + dVar7 * dVar7 + dVar9 * dVar9;
    dVar7 = SQRT(dVar11);
    local_48 = -(ulong)(9.999999999999999e-33 < dVar11);
    uStack_40 = 0;
    dVar9 = (double)((ulong)(dVar7 * 0.5) & local_48);
    dVar8 = cos(dVar9);
    local_28 = dVar8;
    dVar9 = sin(dVar9);
    bVar5 = (this->q_).assertMsg_.b_ != (char *)0x0 & (this->q_).isSet_.b_;
    if (bVar2 == false) {
      if (bVar5 != 0) {
        dVar12 = dVar9 * (double)(~local_48 & 0x3ff0000000000000 |
                                 (ulong)(local_38 / dVar7) & local_48);
        if (9.999999999999999e-33 < dVar11) {
          auVar16._8_8_ = dVar7;
          auVar16._0_8_ = dVar7;
          auVar14 = divpd(auVar14,auVar16);
        }
        else {
          auVar14 = ZEXT816(0);
        }
        dVar10 = dVar9 * auVar14._0_8_;
        dVar9 = dVar9 * auVar14._8_8_;
        dVar7 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[0];
        dVar11 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 8);
        dVar19 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x10);
        dVar22 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x18);
        dVar20 = dVar12 * dVar7 - dVar10 * dVar19;
        auVar18._8_4_ = SUB84(dVar20,0);
        auVar18._0_8_ = dVar12 * dVar11 - dVar10 * dVar22;
        auVar18._12_4_ = (int)((ulong)dVar20 >> 0x20);
        auVar18 = auVar18 ^ _DAT_0011c0d0;
        dVar20 = dVar10 * dVar7 + dVar12 * dVar19;
        auVar14._8_4_ = SUB84(dVar20,0);
        auVar14._0_8_ = dVar10 * dVar11 + dVar12 * dVar22;
        auVar14._12_4_ = (int)((ulong)dVar20 >> 0x20);
        auVar14 = auVar14 ^ _DAT_0011c140;
        (this->q_).isSet_.b_ = true;
        (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = auVar18._0_8_ + dVar9 * dVar19 + dVar8 * dVar7;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 8) = auVar18._8_8_ + dVar9 * dVar22 + dVar8 * dVar11;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x10) = auVar14._0_8_ + (dVar8 * dVar19 - dVar9 * dVar7);
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x18) = auVar14._8_8_ + (dVar8 * dVar22 - dVar9 * dVar11);
        return this;
      }
    }
    else if (bVar5 != 0) {
      dVar12 = dVar9 * (double)(~local_48 & 0x3ff0000000000000 |
                               (ulong)(local_38 / dVar7) & local_48);
      if (9.999999999999999e-33 < dVar11) {
        auVar17._8_8_ = dVar7;
        auVar17._0_8_ = dVar7;
        auVar14 = divpd(auVar14,auVar17);
      }
      else {
        auVar14 = ZEXT816(0);
      }
      dVar10 = dVar9 * auVar14._0_8_;
      dVar9 = dVar9 * auVar14._8_8_;
      dVar7 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
      dVar11 = *(double *)
                ((long)(this->q_).v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array + 8);
      dVar19 = *(double *)
                ((long)(this->q_).v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array + 0x10);
      dVar22 = *(double *)
                ((long)(this->q_).v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array + 0x18);
      dVar20 = dVar12 * dVar7 - dVar10 * dVar19;
      auVar21._8_4_ = SUB84(dVar20,0);
      auVar21._0_8_ = dVar12 * dVar11 - dVar10 * dVar22;
      auVar21._12_4_ = (int)((ulong)dVar20 >> 0x20);
      auVar21 = auVar21 ^ _DAT_0011c0d0;
      dVar20 = dVar10 * dVar7 + dVar12 * dVar19;
      auVar15._8_4_ = SUB84(dVar20,0);
      auVar15._0_8_ = dVar10 * dVar11 + dVar12 * dVar22;
      auVar15._12_4_ = (int)((ulong)dVar20 >> 0x20);
      auVar15 = auVar15 ^ _DAT_0011c140;
      (this->q_).isSet_.b_ = true;
      (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = auVar21._0_8_ + dVar9 * dVar19 + dVar8 * dVar7;
      *(double *)
       ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 8) = auVar21._8_8_ + dVar9 * dVar22 + dVar8 * dVar11;
      *(double *)
       ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 0x10) = auVar15._0_8_ + (dVar8 * dVar19 - dVar9 * dVar7);
      *(double *)
       ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 0x18) = auVar15._8_8_ + (dVar8 * dVar22 - dVar9 * dVar11);
      if (((this->m_).isSet_.b_ == true) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
        dVar7 = dVar12 + dVar12;
        dVar19 = dVar9 + dVar9;
        dVar22 = dVar8 * (dVar10 + dVar10);
        dVar11 = dVar10 * (dVar10 + dVar10);
        lVar6 = 0;
        do {
          dVar20 = *(double *)
                    ((long)(this->m_).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + lVar6 + 0x10);
          pdVar1 = (double *)
                   ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                          .m_storage.m_data.array + lVar6);
          dVar3 = *pdVar1;
          dVar4 = pdVar1[1];
          *(double *)((long)local_98 + lVar6) =
               dVar4 * (dVar19 * dVar10 - local_28 * dVar7) +
               dVar3 * (1.0 - (dVar12 * dVar7 + dVar9 * dVar19)) +
               dVar20 * (dVar7 * dVar10 + dVar8 * dVar19);
          *(double *)((long)local_98 + lVar6 + 8) =
               dVar4 * (1.0 - (dVar12 * dVar7 + dVar11)) +
               dVar3 * (dVar19 * dVar10 + local_28 * dVar7) + dVar20 * (dVar7 * dVar9 - dVar22);
          *(double *)((long)local_98 + lVar6 + 0x10) =
               (dVar7 * dVar9 + dVar22) * dVar4 + dVar20 * (1.0 - (dVar9 * dVar19 + dVar11)) +
               (dVar7 * dVar10 - dVar8 * dVar19) * dVar3;
          lVar6 = lVar6 + 0x18;
        } while (lVar6 != 0x48);
        goto LAB_00117087;
      }
      goto LAB_0011717a;
    }
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,__function);
}

Assistant:

inline const Orientation & Orientation::integrate(Vector3 dt_x_omega)
{
  check_();
  if(q_.isSet())
  {
    if(isMatrixSet())
    {
      Quaternion q = kine::rotationVectorToQuaternion(dt_x_omega);
      q_ = q * q_();
      m_ = q.toRotationMatrix() * m_();
    }
    else
    {
      q_ = kine::rotationVectorToQuaternion(dt_x_omega) * q_();
    }
  }
  else
  {
    m_ = kine::rotationVectorToRotationMatrix(dt_x_omega) * m_();
  }
  return *this;
}